

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_config.c
# Opt level: O0

int main(void)

{
  int iVar1;
  size_t sVar2;
  yajl_val pyVar3;
  yajl_val v;
  char *path [3];
  char errbuf [1024];
  yajl_val node;
  size_t rd;
  char *local_458;
  yajl_val in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  yajl_type type;
  char **in_stack_fffffffffffffbc0;
  char *pcVar4;
  char local_418 [16];
  size_t in_stack_fffffffffffffbf8;
  char *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  int local_4;
  
  type = (yajl_type)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  local_418[0] = '\0';
  fileData[0] = '\0';
  sVar2 = fread(fileData,1,0xffff,_stdin);
  if ((sVar2 == 0) && (iVar1 = feof(_stdin), iVar1 == 0)) {
    fprintf(_stderr,"error encountered on file read\n");
    return 1;
  }
  if (sVar2 < 0xffff) {
    pyVar3 = yajl_tree_parse(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                             in_stack_fffffffffffffbf8);
    if (pyVar3 == (yajl_val)0x0) {
      fprintf(_stderr,"parse_error: ");
      sVar2 = strlen(local_418);
      if (sVar2 == 0) {
        fprintf(_stderr,"unknown error");
      }
      else {
        fprintf(_stderr," %s",local_418);
      }
      fprintf(_stderr,"\n");
      local_4 = 1;
    }
    else {
      pcVar4 = "Logging";
      pyVar3 = yajl_tree_get((yajl_val)"Logging",in_stack_fffffffffffffbc0,type);
      if (pyVar3 == (yajl_val)0x0) {
        printf("no such node: %s/%s\n",pcVar4,"timeFormat");
      }
      else {
        if ((pyVar3 == (yajl_val)0x0) || (pyVar3->type != yajl_t_string)) {
          local_458 = (char *)0x0;
        }
        else {
          local_458 = (pyVar3->u).string;
        }
        printf("%s/%s: %s\n",pcVar4,"timeFormat",local_458);
        in_stack_fffffffffffffbb0 = (yajl_val)pcVar4;
      }
      yajl_tree_free(in_stack_fffffffffffffbb0);
      local_4 = 0;
    }
  }
  else {
    fprintf(_stderr,"config file too big\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
main(void)
{
    size_t rd;
    yajl_val node;
    char errbuf[1024];

    /* null plug buffers */
    fileData[0] = errbuf[0] = 0;

    /* read the entire config file */
    rd = fread((void *) fileData, 1, sizeof(fileData) - 1, stdin);

    /* file read error handling */
    if (rd == 0 && !feof(stdin)) {
        fprintf(stderr, "error encountered on file read\n");
        return 1;
    } else if (rd >= sizeof(fileData) - 1) {
        fprintf(stderr, "config file too big\n");
        return 1;
    }

    /* we have the whole config file in memory.  let's parse it ... */
    node = yajl_tree_parse((const char *) fileData, errbuf, sizeof(errbuf));

    /* parse error handling */
    if (node == NULL) {
        fprintf(stderr, "parse_error: ");
        if (strlen(errbuf)) fprintf(stderr, " %s", errbuf);
        else fprintf(stderr, "unknown error");
        fprintf(stderr, "\n");
        return 1;
    }

    /* ... and extract a nested value from the config file */
    {
        const char * path[] = { "Logging", "timeFormat", (const char *) 0 };
        yajl_val v = yajl_tree_get(node, path, yajl_t_string);
        if (v) printf("%s/%s: %s\n", path[0], path[1], YAJL_GET_STRING(v));
        else   printf("no such node: %s/%s\n", path[0], path[1]);
    }

    yajl_tree_free(node);

    return 0;
}